

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O1

double __thiscall despot::BaseRockSample::Reward(BaseRockSample *this,int s,ACT_TYPE a)

{
  int iVar1;
  long in_RAX;
  uint *puVar2;
  int iVar3;
  double dVar4;
  undefined8 local_28;
  
  local_28 = in_RAX;
  iVar1 = (**(code **)(*(long *)this + 0x10))();
  dVar4 = 0.0;
  if (iVar1 + -1 != s) {
    if (a < 4) {
      iVar3 = s >> ((byte)this->num_rocks_ & 0x1f);
      iVar1 = (this->grid_).xsize_;
      despot::Coord::Coord((Coord *)&local_28,iVar3 % iVar1,iVar3 / iVar1);
      despot::operator+=((Coord *)&local_28,(Coord *)(&Compass::DIRECTIONS + a));
      if (((((int)local_28 < 0) || (local_28 < 0)) || ((this->grid_).xsize_ <= (int)local_28)) ||
         (dVar4 = 0.0, (this->grid_).ysize_ <= local_28._4_4_)) {
        iVar1 = -100;
        if ((int)local_28 == (this->grid_).xsize_) {
          iVar1 = 10;
        }
        dVar4 = (double)iVar1;
      }
    }
    else if (a == 4) {
      iVar3 = s >> ((byte)this->num_rocks_ & 0x1f);
      iVar1 = (this->grid_).xsize_;
      despot::Coord::Coord((Coord *)&local_28,iVar3 % iVar1,iVar3 / iVar1);
      puVar2 = (uint *)Grid<int>::operator()(&this->grid_,(Coord *)&local_28);
      if ((int)*puVar2 < 0) {
        dVar4 = -100.0;
      }
      else {
        dVar4 = *(double *)(&DAT_00115060 + (ulong)(((uint)s >> (*puVar2 & 0x1f) & 1) == 0) * 8);
      }
    }
  }
  return dVar4;
}

Assistant:

double BaseRockSample::Reward(int s, ACT_TYPE a) const {
	if (s == NumStates() - 1)
		return 0;

	if (a < E_SAMPLE) {
		Coord rob_pos = IndexToCoord(s >> num_rocks_);
		rob_pos += Compass::DIRECTIONS[a];
		if (grid_.Inside(rob_pos)) {
			return 0;
		} else
			return rob_pos.x == grid_.xsize() ? 10 : -100;
	} else if (a == E_SAMPLE) {
		Coord rob_pos = IndexToCoord(s >> num_rocks_);
		int rock = grid_(rob_pos);
		if (rock >= 0) {
			bool valuable = CheckFlag(s, rock);
			if (valuable)
				return 10;
			else
				return -10;
		}
		return -100;
	} else
		return 0;
}